

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_pitch.c
# Opt level: O0

int guess_file_type(char *file,FILE *infh,ps_config_t *config)

{
  int iVar1;
  ps_type_t pVar2;
  size_t sVar3;
  undefined1 local_2c [4];
  ps_config_t *ppStack_28;
  char header [4];
  ps_config_t *config_local;
  FILE *infh_local;
  char *file_local;
  
  ppStack_28 = config;
  fseek((FILE *)infh,0,0);
  sVar3 = fread(local_2c,1,4,(FILE *)infh);
  if (sVar3 == 4) {
    iVar1 = memcmp(local_2c,"RIFF",4);
    if (iVar1 == 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_pitch.c"
              ,0xa9,"%s appears to be a WAV file\n",file);
      pVar2 = ps_config_typeof(ppStack_28,"mswav");
      if (pVar2 != 0) {
        ps_config_set_bool(ppStack_28,"mswav",1);
        ps_config_set_bool(ppStack_28,"nist",0);
        ps_config_set_bool(ppStack_28,"raw",0);
      }
    }
    else {
      iVar1 = memcmp(local_2c,"NIST",4);
      if (iVar1 == 0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_pitch.c"
                ,0xb1,"%s appears to be a NIST SPHERE file\n",file);
        pVar2 = ps_config_typeof(ppStack_28,"mswav");
        if (pVar2 != 0) {
          ps_config_set_bool(ppStack_28,"mswav",0);
          ps_config_set_bool(ppStack_28,"nist",1);
          ps_config_set_bool(ppStack_28,"raw",0);
        }
      }
      else {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_pitch.c"
                ,0xb9,"%s appears to be raw data\n",file);
        pVar2 = ps_config_typeof(ppStack_28,"mswav");
        if (pVar2 != 0) {
          ps_config_set_bool(ppStack_28,"mswav",0);
          ps_config_set_bool(ppStack_28,"nist",0);
          ps_config_set_bool(ppStack_28,"raw",1);
        }
      }
    }
    fseek((FILE *)infh,0,0);
    file_local._4_4_ = 0;
  }
  else {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_pitch.c"
                   ,0xa5,"Failed to read 4 byte header");
    file_local._4_4_ = -1;
  }
  return file_local._4_4_;
}

Assistant:

static int
guess_file_type(char const *file, FILE *infh, ps_config_t *config)
{
    char header[4];

    fseek(infh, 0, SEEK_SET);
    if (fread(header, 1, 4, infh) != 4) {
        E_ERROR_SYSTEM("Failed to read 4 byte header");
        return -1;
    }
    if (0 == memcmp(header, "RIFF", 4)) {
        E_INFO("%s appears to be a WAV file\n", file);
        if (ps_config_typeof(config, "mswav") != 0) {
            ps_config_set_bool(config, "mswav", TRUE);
            ps_config_set_bool(config, "nist", FALSE);
            ps_config_set_bool(config, "raw", FALSE);
        }
    }
    else if (0 == memcmp(header, "NIST", 4)) {
        E_INFO("%s appears to be a NIST SPHERE file\n", file);
        if (ps_config_typeof(config, "mswav") != 0) {
            ps_config_set_bool(config, "mswav", FALSE);
            ps_config_set_bool(config, "nist", TRUE);
            ps_config_set_bool(config, "raw", FALSE);
        }
    }
    else {
        E_INFO("%s appears to be raw data\n", file);
        if (ps_config_typeof(config, "mswav") != 0) {
            ps_config_set_bool(config, "mswav", FALSE);
            ps_config_set_bool(config, "nist", FALSE);
            ps_config_set_bool(config, "raw", TRUE);
        }
    }
    fseek(infh, 0, SEEK_SET);
    return 0;
}